

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pi.c
# Opt level: O1

void pi_update_decode_poc
               (opj_pi_iterator_t *p_pi,opj_tcp_v2_t *p_tcp,OPJ_UINT32 p_max_precision,
               OPJ_UINT32 p_max_res)

{
  undefined8 uVar1;
  OPJ_UINT32 OVar2;
  int iVar3;
  OPJ_PROG_ORDER *pOVar4;
  OPJ_PROG_ORDER *pOVar5;
  
  if (p_tcp->numpocs != 0xffffffff) {
    pOVar4 = &p_tcp->pocs[0].prg;
    pOVar5 = &(p_pi->poc).prg;
    iVar3 = p_tcp->numpocs + 1;
    do {
      *pOVar5 = *pOVar4;
      pOVar5[-10] = RLCP;
      *(undefined8 *)(pOVar5 + -4) = LRCP;
      pOVar5[-5] = pOVar4[-5];
      OVar2 = ((opj_poc_t *)(pOVar4 + -9))->compno0;
      uVar1 = *(undefined8 *)(pOVar4 + -7);
      ((opj_poc_t *)(pOVar5 + -9))->resno0 = ((opj_poc_t *)(pOVar4 + -9))->resno0;
      ((opj_poc_t *)(pOVar5 + -9))->compno0 = OVar2;
      *(undefined8 *)(pOVar5 + -7) = uVar1;
      pOVar5[-2] = p_max_precision;
      pOVar4 = pOVar4 + 0x25;
      pOVar5 = pOVar5 + 0x3e;
      iVar3 = iVar3 + -1;
    } while (iVar3 != 0);
  }
  return;
}

Assistant:

void pi_update_decode_poc (opj_pi_iterator_t * p_pi,opj_tcp_v2_t * p_tcp,OPJ_UINT32 p_max_precision,OPJ_UINT32 p_max_res)
{
	// loop
	OPJ_UINT32 pino;

	// encoding prameters to set
	OPJ_UINT32 l_bound;

	opj_pi_iterator_t * l_current_pi = 00;
	opj_poc_t* l_current_poc = 0;

	// preconditions in debug
	assert(p_pi != 00);
	assert(p_tcp != 00);

	// initializations
	l_bound = p_tcp->numpocs+1;
	l_current_pi = p_pi;
	l_current_poc = p_tcp->pocs;

	for
		(pino = 0;pino<l_bound;++pino)
	{
		l_current_pi->poc.prg = l_current_poc->prg;
		l_current_pi->first = 1;

		l_current_pi->poc.resno0 = l_current_poc->resno0;
		l_current_pi->poc.compno0 = l_current_poc->compno0;
		l_current_pi->poc.layno0 = 0;
		l_current_pi->poc.precno0 = 0;
		l_current_pi->poc.resno1 = l_current_poc->resno1;
		l_current_pi->poc.compno1 = l_current_poc->compno1;
		l_current_pi->poc.layno1 = l_current_poc->layno1;
		l_current_pi->poc.precno1 = p_max_precision;
		++l_current_pi;
		++l_current_poc;
	}
}